

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

longdouble *
calc_sd_right_to_left<long_double,float>
          (longdouble *__return_storage_ptr__,float *x,float xmean,size_t *ix_arr,size_t st,
          size_t end,double *sd_arr)

{
  float fVar1;
  float fVar2;
  float fVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float fVar7;
  double dVar8;
  
  if ((size_t *)st != ix_arr) {
    fVar2 = 0.0;
    lVar4 = 1;
    fVar3 = 0.0;
    lVar6 = 0;
    fVar1 = *(float *)((long)__return_storage_ptr__ + *(long *)(x + st * 2) * 4) - xmean;
    do {
      fVar7 = *(float *)((long)__return_storage_ptr__ + *(long *)(x + st * 2 + lVar6 * 2) * 4) -
              xmean;
      fVar3 = fVar3 + (fVar7 - fVar3) / ((float)lVar4 + (float)(&DAT_0036b0d8)[lVar4 < 0]);
      fVar2 = (fVar7 - fVar3) * (fVar7 - fVar1) + fVar2;
      dVar8 = 0.0;
      lVar5 = lVar6 + -1;
      if (lVar6 != 0) {
        dVar8 = (double)SQRT(fVar2 / ((float)lVar4 + (float)(&DAT_0036b0d8)[lVar4 < 0]));
      }
      *(double *)(end + st * 8 + (long)ix_arr * -8 + lVar6 * 8) = dVar8;
      lVar4 = lVar4 + 1;
      lVar6 = lVar5;
      fVar1 = fVar3;
    } while ((long)ix_arr - st != lVar5);
  }
  return (longdouble *)&DAT_0036b0d8;
}

Assistant:

real_t calc_sd_right_to_left(real_t_ *restrict x, real_t_ xmean, size_t ix_arr[], size_t st, size_t end, double *restrict sd_arr)
{
    real_t running_mean = 0;
    real_t running_ssq = 0;
    real_t mean_prev = x[ix_arr[end]] - xmean;
    size_t n = end - st + 1;
    for (size_t row = 0; row < n-1; row++)
    {
        running_mean   += ((x[ix_arr[end-row]] - xmean) - running_mean) / (real_t)(row+1);
        running_ssq    += ((x[ix_arr[end-row]] - xmean) - running_mean) * ((x[ix_arr[end-row]] - xmean) - mean_prev);
        mean_prev       =  running_mean;
        sd_arr[n-row-1] = (row == 0)? 0. : std::sqrt(running_ssq / (real_t)(row+1));
    }
    running_mean   += ((x[ix_arr[st]] - xmean) - running_mean) / (real_t)n;
    running_ssq    += ((x[ix_arr[st]] - xmean) - running_mean) * ((x[ix_arr[st]] - xmean) - mean_prev);
    return std::sqrt(running_ssq / (real_t)n);
}